

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libypspur-md.c
# Opt level: O0

int YPSpur_md_over_line(YPSpur *spur,int cs,double x,double y,double theta)

{
  int iVar1;
  undefined1 auStack_70 [4];
  int len;
  YPSpur_msg msg;
  double theta_local;
  double y_local;
  double x_local;
  int cs_local;
  YPSpur *spur_local;
  
  _auStack_70 = 1;
  msg.msg_type = (long)spur->pid;
  msg.pid._0_4_ = 0x74;
  msg.pid._4_4_ = cs;
  msg._16_8_ = x;
  msg.data[0] = y;
  msg.data[1] = theta;
  msg.data[3] = theta;
  iVar1 = (*(spur->dev).send)(&spur->dev,(YPSpur_msg *)auStack_70);
  if (iVar1 < 0) {
    spur->connection_error = 1;
    spur_local._4_4_ = -1;
  }
  else {
    iVar1 = (*(spur->dev).recv)(&spur->dev,(YPSpur_msg *)auStack_70);
    if (iVar1 < 0) {
      spur->connection_error = 1;
      spur_local._4_4_ = -1;
    }
    else {
      spur_local._4_4_ = msg.pid._4_4_;
    }
  }
  return spur_local._4_4_;
}

Assistant:

int YPSpur_md_over_line(YPSpur* spur, int cs, double x, double y, double theta)
{
  YPSpur_msg msg;
  int len;

  msg.msg_type = YPSPUR_MSG_CMD;
  msg.pid = spur->pid;
  msg.type = YPSPUR_OVER_LINE;
  msg.data[0] = x;
  msg.data[1] = y;
  msg.data[2] = theta;
  msg.cs = cs;
  if (spur->dev.send(&spur->dev, &msg) < 0)
  {
    /* error */
    spur->connection_error = 1;
    return -1;
  }

  /* 指定のコマンド受け取り */
  len = spur->dev.recv(&spur->dev, &msg);
  if (len < 0)
  {
    /* receive error */
    spur->connection_error = 1;
    return -1;
  }

  return msg.cs;
}